

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O0

void __thiscall
nigel::IMC_Generator::parseCondition
          (IMC_Generator *this,shared_ptr<nigel::AstExpr> *ast,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
          *varList)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  u32 uVar3;
  OperationType ot_00;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  mapped_type *pmVar10;
  element_type *peVar11;
  element_type *peVar12;
  shared_ptr<nigel::Token> local_960;
  shared_ptr<nigel::IM_Operator> local_950;
  shared_ptr<nigel::IM_Constant> local_940;
  shared_ptr<nigel::IM_Operator> local_930;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_920;
  shared_ptr<nigel::AstExpr> local_8f0;
  undefined1 local_8e0 [8];
  shared_ptr<nigel::IM_Command> conditionPos_1;
  shared_ptr<nigel::AstExpr> local_8a0;
  shared_ptr<nigel::IM_Operator> local_890;
  shared_ptr<nigel::IM_Condition> local_880;
  shared_ptr<nigel::IM_Operator> local_870;
  shared_ptr<nigel::IM_Operator> local_860;
  shared_ptr<nigel::IM_Constant> local_850;
  shared_ptr<nigel::IM_Operator> local_840;
  shared_ptr<nigel::IM_Operator> local_830;
  shared_ptr<nigel::IM_Constant> local_820;
  shared_ptr<nigel::IM_Operator> local_810;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_800;
  shared_ptr<nigel::AstExpr> local_7d0;
  u32 local_7bc;
  undefined1 local_7b8 [4];
  u32 id_1;
  shared_ptr<nigel::IM_Command> conditionPos;
  shared_ptr<nigel::AstExpr> local_778;
  shared_ptr<nigel::IM_Operator> local_768;
  shared_ptr<nigel::IM_Condition> local_758;
  shared_ptr<nigel::IM_Operator> local_748;
  shared_ptr<nigel::IM_Operator> local_738;
  shared_ptr<nigel::IM_Constant> local_728;
  shared_ptr<nigel::IM_Operator> local_718;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_708;
  shared_ptr<nigel::AstExpr> local_6d8;
  u32 local_6c4;
  undefined1 local_6c0 [4];
  u32 id;
  shared_ptr<nigel::AstComparisonCondition> a_1;
  shared_ptr<nigel::IM_Constant> local_6a0;
  shared_ptr<nigel::IM_Operator> local_690;
  shared_ptr<nigel::Token> local_680;
  shared_ptr<nigel::IM_Operator> local_670;
  shared_ptr<nigel::IM_Operator> local_660;
  shared_ptr<nigel::IM_Operator> local_650;
  shared_ptr<nigel::IM_Operator> local_640;
  shared_ptr<nigel::IM_Operator> local_630;
  shared_ptr<nigel::IM_Constant> local_620;
  shared_ptr<nigel::IM_Operator> local_610;
  shared_ptr<nigel::IM_Operator> local_600;
  shared_ptr<nigel::IM_Constant> local_5f0;
  shared_ptr<nigel::IM_Operator> local_5e0;
  shared_ptr<nigel::Token> local_5d0;
  shared_ptr<nigel::IM_Operator> local_5c0;
  shared_ptr<nigel::IM_Operator> local_5b0;
  shared_ptr<nigel::IM_Operator> local_5a0;
  shared_ptr<nigel::IM_Operator> local_590;
  shared_ptr<nigel::IM_Operator> local_580;
  shared_ptr<nigel::IM_Constant> local_570;
  shared_ptr<nigel::IM_Operator> local_560;
  shared_ptr<nigel::IM_Operator> local_550;
  shared_ptr<nigel::IM_Constant> local_540;
  shared_ptr<nigel::IM_Operator> local_530;
  shared_ptr<nigel::Token> local_520;
  shared_ptr<nigel::IM_Operator> local_510;
  shared_ptr<nigel::IM_Operator> local_500;
  shared_ptr<nigel::IM_Operator> local_4f0;
  shared_ptr<nigel::IM_Operator> local_4e0;
  shared_ptr<nigel::IM_Operator> local_4d0;
  shared_ptr<nigel::IM_Constant> local_4c0;
  shared_ptr<nigel::IM_Operator> local_4b0;
  shared_ptr<nigel::Token> local_4a0;
  shared_ptr<nigel::IM_Operator> local_490;
  shared_ptr<nigel::IM_Operator> local_480;
  shared_ptr<nigel::IM_Operator> local_470;
  shared_ptr<nigel::IM_Operator> local_460;
  shared_ptr<nigel::IM_Operator> local_450;
  shared_ptr<nigel::IM_Constant> local_440;
  shared_ptr<nigel::IM_Operator> local_430;
  shared_ptr<nigel::Token> local_420;
  shared_ptr<nigel::IM_Operator> local_410;
  shared_ptr<nigel::IM_Operator> local_400;
  shared_ptr<nigel::IM_Operator> local_3f0;
  shared_ptr<nigel::IM_Operator> local_3e0;
  shared_ptr<nigel::IM_Operator> local_3d0;
  shared_ptr<nigel::IM_Constant> local_3c0;
  shared_ptr<nigel::IM_Operator> local_3b0;
  shared_ptr<nigel::Token> local_3a0;
  shared_ptr<nigel::IM_Operator> local_390;
  shared_ptr<nigel::IM_Operator> local_380;
  shared_ptr<nigel::IM_Operator> local_370;
  shared_ptr<nigel::IM_Operator> local_360;
  shared_ptr<nigel::IM_Operator> local_350;
  shared_ptr<nigel::IM_SFR> local_340;
  shared_ptr<nigel::IM_Operator> local_330;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_320;
  shared_ptr<nigel::AstExpr> local_2f0;
  undefined1 local_2e0 [32];
  AstExpr local_2c0;
  shared_ptr<nigel::IM_Operator> local_290;
  shared_ptr<nigel::IM_Operator> local_280;
  shared_ptr<nigel::IM_SFR> local_270;
  shared_ptr<nigel::IM_Operator> local_260;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_250;
  shared_ptr<nigel::AstExpr> local_220;
  undefined1 local_210 [32];
  undefined1 local_1f0 [24];
  shared_ptr<nigel::IM_Operator> rOp;
  shared_ptr<nigel::IM_Operator> lOp;
  undefined1 local_1b8 [4];
  OC comb;
  shared_ptr<nigel::AstComparisonCondition> a;
  shared_ptr<nigel::IM_Constant> local_198;
  shared_ptr<nigel::IM_Operator> local_188;
  shared_ptr<nigel::IM_Operator> local_178;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_168;
  shared_ptr<nigel::AstExpr> local_138;
  undefined1 local_128 [32];
  undefined1 local_108 [24];
  shared_ptr<nigel::IM_Operator> op;
  undefined1 local_e0 [4];
  OperationType ot;
  undefined1 local_d0 [8];
  shared_ptr<nigel::AstReturning> ret;
  shared_ptr<nigel::IM_Constant> local_b0;
  shared_ptr<nigel::IM_Operator> local_a0;
  undefined1 local_90 [80];
  element_type *local_20;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  *varList_local;
  shared_ptr<nigel::AstExpr> *ast_local;
  IMC_Generator *this_local;
  
  local_20 = (element_type *)varList;
  varList_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
        *)ast;
  ast_local = (shared_ptr<nigel::AstExpr> *)this;
  peVar4 = std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)ast);
  if (peVar4->type == booleanParenthesis) {
    std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)ast)
    ;
    AstExpr::as<nigel::AstBooleanParenthesis>((AstExpr *)&stack0xffffffffffffffc0);
    peVar5 = std::
             __shared_ptr_access<nigel::AstBooleanParenthesis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::AstBooleanParenthesis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&stack0xffffffffffffffc0);
    std::shared_ptr<nigel::AstExpr>::shared_ptr<nigel::AstCondition,void>
              ((shared_ptr<nigel::AstExpr> *)&stack0xffffffffffffffd0,&peVar5->content);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
           *)(local_90 + 0x20),varList);
    parseCondition(this,(shared_ptr<nigel::AstExpr> *)&stack0xffffffffffffffd0,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                    *)(local_90 + 0x20));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
            *)(local_90 + 0x20));
    std::shared_ptr<nigel::AstExpr>::~shared_ptr
              ((shared_ptr<nigel::AstExpr> *)&stack0xffffffffffffffd0);
    std::shared_ptr<nigel::AstBooleanParenthesis>::~shared_ptr
              ((shared_ptr<nigel::AstBooleanParenthesis> *)&stack0xffffffffffffffc0);
    return;
  }
  peVar4 = std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)ast);
  if (peVar4->type == keywordCondition) {
    std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)ast)
    ;
    AstExpr::as<nigel::AstKeywordCondition>((AstExpr *)local_90);
    peVar6 = std::
             __shared_ptr_access<nigel::AstKeywordCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::AstKeywordCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_90);
    bVar2 = peVar6->val;
    std::shared_ptr<nigel::AstKeywordCondition>::~shared_ptr
              ((shared_ptr<nigel::AstKeywordCondition> *)local_90);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return;
    }
    IM_Constant::fromConstant((u8)&local_b0);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_Constant,void>(&local_a0,&local_b0);
    p_Var1 = &ret.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::shared_ptr<nigel::IM_Operator>::shared_ptr
              ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
    addCmd(this,jmp_rel,&local_a0,(shared_ptr<nigel::IM_Operator> *)p_Var1);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr
              ((shared_ptr<nigel::IM_Operator> *)
               &ret.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_a0);
    std::shared_ptr<nigel::IM_Constant>::~shared_ptr(&local_b0);
    return;
  }
  peVar4 = std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)ast);
  if (peVar4->type == arithmenticCondition) {
    std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)ast)
    ;
    AstExpr::as<nigel::AstArithmeticCondition>((AstExpr *)local_e0);
    peVar7 = std::
             __shared_ptr_access<nigel::AstArithmeticCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::AstArithmeticCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_e0);
    std::shared_ptr<nigel::AstReturning>::shared_ptr
              ((shared_ptr<nigel::AstReturning> *)local_d0,&peVar7->ret);
    std::shared_ptr<nigel::AstArithmeticCondition>::~shared_ptr
              ((shared_ptr<nigel::AstArithmeticCondition> *)local_e0);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr
              ((shared_ptr<nigel::IM_Operator> *)(local_108 + 0x10));
    peVar8 = std::__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_d0);
    if ((peVar8->super_AstExpr).type == variable) {
      op.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = v;
      std::__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_d0);
      AstExpr::as<nigel::AstVariable>((AstExpr *)local_108);
      peVar9 = std::
               __shared_ptr_access<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_108);
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                ::operator[](varList,&peVar9->name);
      std::shared_ptr<nigel::IM_Operator>::operator=
                ((shared_ptr<nigel::IM_Operator> *)(local_108 + 0x10),pmVar10);
      std::shared_ptr<nigel::AstVariable>::~shared_ptr((shared_ptr<nigel::AstVariable> *)local_108);
    }
    else {
      peVar8 = std::
               __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_d0);
      if ((peVar8->super_AstExpr).type == literal) {
        op.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = c;
        std::__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_d0);
        AstExpr::as<nigel::AstLiteral>((AstExpr *)local_128);
        IM_Constant::fromAstLiteral
                  ((IM_Constant *)(local_128 + 0x10),(shared_ptr<nigel::AstLiteral> *)local_128);
        std::shared_ptr<nigel::IM_Operator>::operator=
                  ((shared_ptr<nigel::IM_Operator> *)(local_108 + 0x10),
                   (shared_ptr<nigel::IM_Constant> *)(local_128 + 0x10));
        std::shared_ptr<nigel::IM_Constant>::~shared_ptr
                  ((shared_ptr<nigel::IM_Constant> *)(local_128 + 0x10));
        std::shared_ptr<nigel::AstLiteral>::~shared_ptr((shared_ptr<nigel::AstLiteral> *)local_128);
      }
      else {
        peVar8 = std::
                 __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_d0);
        if (((((peVar8->super_AstExpr).type == term) ||
             (peVar8 = std::
                       __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_d0), (peVar8->super_AstExpr).type == unary)) ||
            (peVar8 = std::
                      __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_d0), (peVar8->super_AstExpr).type == parenthesis)) ||
           (((peVar8 = std::
                       __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_d0), (peVar8->super_AstExpr).type == functionCall ||
             (peVar8 = std::
                       __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_d0), (peVar8->super_AstExpr).type == refer)) ||
            (peVar8 = std::
                      __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_d0), (peVar8->super_AstExpr).type == derefer)))) {
          op.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = t;
          std::shared_ptr<nigel::AstExpr>::shared_ptr<nigel::AstReturning,void>
                    (&local_138,(shared_ptr<nigel::AstReturning> *)local_d0);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
          ::map(&local_168,varList);
          parseAst(this,&local_138,&local_168);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
          ::~map(&local_168);
          std::shared_ptr<nigel::AstExpr>::~shared_ptr(&local_138);
        }
      }
    }
    ot_00 = op.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_4_;
    std::shared_ptr<nigel::IM_Operator>::shared_ptr
              (&local_178,(shared_ptr<nigel::IM_Operator> *)(local_108 + 0x10));
    generateMoveA(this,ot_00,&local_178);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_178);
    IM_Constant::fromConstant((u8)&local_198);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_Constant,void>(&local_188,&local_198);
    p_Var1 = &a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    std::shared_ptr<nigel::IM_Operator>::shared_ptr
              ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
    addCmd(this,jmp_z_rel,&local_188,(shared_ptr<nigel::IM_Operator> *)p_Var1);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr
              ((shared_ptr<nigel::IM_Operator> *)
               &a.super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_188);
    std::shared_ptr<nigel::IM_Constant>::~shared_ptr(&local_198);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr
              ((shared_ptr<nigel::IM_Operator> *)(local_108 + 0x10));
    std::shared_ptr<nigel::AstReturning>::~shared_ptr((shared_ptr<nigel::AstReturning> *)local_d0);
    return;
  }
  peVar4 = std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)ast);
  if (peVar4->type != comparisonCondition) {
    peVar4 = std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)ast);
    if (peVar4->type == combinationCondition) {
      std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 ast);
      AstExpr::as<nigel::AstComparisonCondition>((AstExpr *)local_6c0);
      peVar11 = std::
                __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_6c0);
      if (peVar11->op == op_and_log) {
        local_6c4 = IM_Condition::getNextConditionPos();
        peVar11 = std::
                  __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_6c0);
        std::shared_ptr<nigel::AstExpr>::shared_ptr<nigel::AstReturning,void>
                  (&local_6d8,&peVar11->lVal);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
        ::map(&local_708,varList);
        parseCondition(this,&local_6d8,&local_708);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
        ::~map(&local_708);
        std::shared_ptr<nigel::AstExpr>::~shared_ptr(&local_6d8);
        IM_Constant::fromConstant((u8)&local_728);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_Constant,void>
                  (&local_718,&local_728);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_738,(nullptr_t)0x0);
        addCmd(this,jmp_rel,&local_718,&local_738);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_738);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_718);
        std::shared_ptr<nigel::IM_Constant>::~shared_ptr(&local_728);
        IM_Condition::getNew((u32)&local_758,SUB41(local_6c4,0));
        std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_Condition,void>
                  (&local_748,&local_758);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_768,(nullptr_t)0x0);
        addCmd(this,jmp_abs,&local_748,&local_768);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_768);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_748);
        std::shared_ptr<nigel::IM_Condition>::~shared_ptr(&local_758);
        peVar11 = std::
                  __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_6c0);
        std::shared_ptr<nigel::AstExpr>::shared_ptr<nigel::AstReturning,void>
                  (&local_778,&peVar11->rVal);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
               *)&conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,varList);
        parseCondition(this,&local_778,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                        *)&conditionPos.
                           super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                *)&conditionPos.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount);
        std::shared_ptr<nigel::AstExpr>::~shared_ptr(&local_778);
        std::make_shared<nigel::IM_Command>();
        peVar12 = std::
                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_7b8);
        uVar3 = local_6c4;
        peVar12->type = conditionEnd;
        peVar12 = std::
                  __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_7b8);
        peVar12->id = uVar3;
        std::__cxx11::
        list<std::shared_ptr<nigel::IM_Command>,_std::allocator<std::shared_ptr<nigel::IM_Command>_>_>
        ::push_back(&this->base->imCommands,(value_type *)local_7b8);
        std::shared_ptr<nigel::IM_Command>::~shared_ptr((shared_ptr<nigel::IM_Command> *)local_7b8);
      }
      else {
        peVar11 = std::
                  __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_6c0);
        if (peVar11->op == op_or_log) {
          local_7bc = IM_Condition::getNextConditionPos();
          peVar11 = std::
                    __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_6c0);
          std::shared_ptr<nigel::AstExpr>::shared_ptr<nigel::AstReturning,void>
                    (&local_7d0,&peVar11->lVal);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
          ::map(&local_800,varList);
          parseCondition(this,&local_7d0,&local_800);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
          ::~map(&local_800);
          std::shared_ptr<nigel::AstExpr>::~shared_ptr(&local_7d0);
          IM_Constant::fromConstant((u8)&local_820);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_Constant,void>
                    (&local_810,&local_820);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_830,(nullptr_t)0x0);
          addCmd(this,jmp_rel,&local_810,&local_830);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_830);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_810);
          std::shared_ptr<nigel::IM_Constant>::~shared_ptr(&local_820);
          IM_Constant::fromConstant((u8)&local_850);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_Constant,void>
                    (&local_840,&local_850);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_860,(nullptr_t)0x0);
          addCmd(this,jmp_rel,&local_840,&local_860);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_860);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_840);
          std::shared_ptr<nigel::IM_Constant>::~shared_ptr(&local_850);
          IM_Condition::getNew((u32)&local_880,SUB41(local_7bc,0));
          std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_Condition,void>
                    (&local_870,&local_880);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_890,(nullptr_t)0x0);
          addCmd(this,jmp_abs,&local_870,&local_890);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_890);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_870);
          std::shared_ptr<nigel::IM_Condition>::~shared_ptr(&local_880);
          peVar11 = std::
                    __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_6c0);
          std::shared_ptr<nigel::AstExpr>::shared_ptr<nigel::AstReturning,void>
                    (&local_8a0,&peVar11->rVal);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                 *)&conditionPos_1.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,varList);
          parseCondition(this,&local_8a0,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                          *)&conditionPos_1.
                             super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
                  *)&conditionPos_1.
                     super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::shared_ptr<nigel::AstExpr>::~shared_ptr(&local_8a0);
          std::make_shared<nigel::IM_Command>();
          peVar12 = std::
                    __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_8e0);
          uVar3 = local_7bc;
          peVar12->type = conditionEnd;
          peVar12 = std::
                    __shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_8e0);
          peVar12->id = uVar3;
          std::__cxx11::
          list<std::shared_ptr<nigel::IM_Command>,_std::allocator<std::shared_ptr<nigel::IM_Command>_>_>
          ::push_back(&this->base->imCommands,(value_type *)local_8e0);
          std::shared_ptr<nigel::IM_Command>::~shared_ptr
                    ((shared_ptr<nigel::IM_Command> *)local_8e0);
        }
        else {
          peVar11 = std::
                    __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_6c0);
          if (peVar11->op == op_not) {
            peVar11 = std::
                      __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_6c0);
            std::shared_ptr<nigel::AstExpr>::shared_ptr<nigel::AstReturning,void>
                      (&local_8f0,&peVar11->rVal);
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
            ::map(&local_920,varList);
            parseCondition(this,&local_8f0,&local_920);
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
            ::~map(&local_920);
            std::shared_ptr<nigel::AstExpr>::~shared_ptr(&local_8f0);
            IM_Constant::fromConstant((u8)&local_940);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_Constant,void>
                      (&local_930,&local_940);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_950,(nullptr_t)0x0);
            addCmd(this,jmp_rel,&local_930,&local_950);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_950);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_930);
            std::shared_ptr<nigel::IM_Constant>::~shared_ptr(&local_940);
          }
        }
      }
      std::shared_ptr<nigel::AstComparisonCondition>::~shared_ptr
                ((shared_ptr<nigel::AstComparisonCondition> *)local_6c0);
      return;
    }
    peVar4 = std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)ast);
    std::shared_ptr<nigel::Token>::shared_ptr(&local_960,&peVar4->token);
    BuilderExecutable::generateNotification
              (&this->super_BuilderExecutable,err_expectConditionInParanthesis,&local_960);
    std::shared_ptr<nigel::Token>::~shared_ptr(&local_960);
    return;
  }
  std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)ast);
  AstExpr::as<nigel::AstComparisonCondition>((AstExpr *)local_1b8);
  std::shared_ptr<nigel::IM_Operator>::shared_ptr
            ((shared_ptr<nigel::IM_Operator> *)
             &rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<nigel::IM_Operator>::shared_ptr
            ((shared_ptr<nigel::IM_Operator> *)(local_1f0 + 0x10));
  peVar11 = std::
            __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_1b8);
  peVar8 = std::__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&peVar11->rVal);
  if ((peVar8->super_AstExpr).type == variable) {
    peVar11 = std::
              __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1b8);
    std::__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )&peVar11->rVal);
    AstExpr::as<nigel::AstVariable>((AstExpr *)local_1f0);
    peVar9 = std::__shared_ptr_access<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_1f0);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
              ::operator[](varList,&peVar9->name);
    std::shared_ptr<nigel::IM_Operator>::operator=
              ((shared_ptr<nigel::IM_Operator> *)(local_1f0 + 0x10),pmVar10);
    std::shared_ptr<nigel::AstVariable>::~shared_ptr((shared_ptr<nigel::AstVariable> *)local_1f0);
  }
  else {
    peVar11 = std::
              __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1b8);
    peVar8 = std::__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar11->rVal);
    if ((peVar8->super_AstExpr).type == literal) {
      peVar11 = std::
                __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_1b8);
      std::__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&peVar11->rVal);
      AstExpr::as<nigel::AstLiteral>((AstExpr *)local_210);
      IM_Constant::fromAstLiteral
                ((IM_Constant *)(local_210 + 0x10),(shared_ptr<nigel::AstLiteral> *)local_210);
      std::shared_ptr<nigel::IM_Operator>::operator=
                ((shared_ptr<nigel::IM_Operator> *)(local_1f0 + 0x10),
                 (shared_ptr<nigel::IM_Constant> *)(local_210 + 0x10));
      std::shared_ptr<nigel::IM_Constant>::~shared_ptr
                ((shared_ptr<nigel::IM_Constant> *)(local_210 + 0x10));
      std::shared_ptr<nigel::AstLiteral>::~shared_ptr((shared_ptr<nigel::AstLiteral> *)local_210);
    }
    else {
      peVar11 = std::
                __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_1b8);
      peVar8 = std::
               __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar11->rVal);
      if ((peVar8->super_AstExpr).type != term) {
        peVar11 = std::
                  __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_1b8);
        peVar8 = std::
                 __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar11->rVal);
        if ((peVar8->super_AstExpr).type != unary) {
          peVar11 = std::
                    __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_1b8);
          peVar8 = std::
                   __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar11->rVal);
          if ((peVar8->super_AstExpr).type != parenthesis) {
            peVar11 = std::
                      __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_1b8);
            peVar8 = std::
                     __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&peVar11->rVal);
            if ((peVar8->super_AstExpr).type != functionCall) {
              peVar11 = std::
                        __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_1b8);
              peVar8 = std::
                       __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&peVar11->rVal);
              if ((peVar8->super_AstExpr).type != refer) {
                peVar11 = std::
                          __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)local_1b8);
                peVar8 = std::
                         __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&peVar11->rVal);
                if ((peVar8->super_AstExpr).type != derefer) goto LAB_002384a0;
              }
            }
          }
        }
      }
      peVar11 = std::
                __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_1b8);
      std::shared_ptr<nigel::AstExpr>::shared_ptr<nigel::AstReturning,void>
                (&local_220,&peVar11->rVal);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::map(&local_250,varList);
      parseAst(this,&local_220,&local_250);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::~map(&local_250);
      std::shared_ptr<nigel::AstExpr>::~shared_ptr(&local_220);
      peVar11 = std::
                __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_1b8);
      peVar8 = std::
               __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar11->lVal);
      if ((peVar8->super_AstExpr).type != term) {
        peVar11 = std::
                  __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_1b8);
        peVar8 = std::
                 __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar11->lVal);
        if ((peVar8->super_AstExpr).type != unary) {
          peVar11 = std::
                    __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_1b8);
          peVar8 = std::
                   __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar11->lVal);
          if ((peVar8->super_AstExpr).type != parenthesis) {
            peVar11 = std::
                      __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_1b8);
            peVar8 = std::
                     __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&peVar11->lVal);
            if ((peVar8->super_AstExpr).type != functionCall) {
              peVar11 = std::
                        __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_1b8);
              peVar8 = std::
                       __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&peVar11->lVal);
              if ((peVar8->super_AstExpr).type != refer) {
                peVar11 = std::
                          __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)local_1b8);
                peVar8 = std::
                         __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&peVar11->lVal);
                if ((peVar8->super_AstExpr).type != derefer) {
                  IM_SFR::getSFR((int)&local_2c0 + 0x20);
                  std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>
                            (&local_290,(shared_ptr<nigel::IM_SFR> *)&local_2c0.token);
                  this_00 = &local_2c0.super_enable_shared_from_this<nigel::AstExpr>._M_weak_this.
                             super___weak_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount;
                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                            ((shared_ptr<nigel::IM_Operator> *)this_00,(nullptr_t)0x0);
                  addCmd(this,mov_adr_a,&local_290,(shared_ptr<nigel::IM_Operator> *)this_00);
                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                            ((shared_ptr<nigel::IM_Operator> *)
                             &local_2c0.super_enable_shared_from_this<nigel::AstExpr>._M_weak_this.
                              super___weak_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_290);
                  std::shared_ptr<nigel::IM_SFR>::~shared_ptr
                            ((shared_ptr<nigel::IM_SFR> *)&local_2c0.token);
                  goto LAB_002384a0;
                }
              }
            }
          }
        }
      }
      IM_SFR::getSFR((SFR)&local_270);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_260,&local_270);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_280,(nullptr_t)0x0);
      addCmd(this,push_adr,&local_260,&local_280);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_280);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_260);
      std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_270);
    }
  }
LAB_002384a0:
  peVar11 = std::
            __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_1b8);
  peVar8 = std::__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&peVar11->lVal);
  if ((peVar8->super_AstExpr).type == variable) {
    peVar11 = std::
              __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1b8);
    std::__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )&peVar11->lVal);
    AstExpr::as<nigel::AstVariable>(&local_2c0);
    peVar9 = std::__shared_ptr_access<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_2c0);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
              ::operator[](varList,&peVar9->name);
    std::shared_ptr<nigel::IM_Operator>::operator=
              ((shared_ptr<nigel::IM_Operator> *)
               &rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               pmVar10);
    std::shared_ptr<nigel::AstVariable>::~shared_ptr((shared_ptr<nigel::AstVariable> *)&local_2c0);
    peVar11 = std::
              __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1b8);
    peVar8 = std::__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar11->rVal);
    if ((peVar8->super_AstExpr).type == variable) {
      lOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = vv;
    }
    else {
      peVar11 = std::
                __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_1b8);
      peVar8 = std::
               __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar11->rVal);
      if ((peVar8->super_AstExpr).type == literal) {
        lOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = vc;
      }
      else {
        peVar11 = std::
                  __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_1b8);
        peVar8 = std::
                 __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar11->rVal);
        if ((peVar8->super_AstExpr).type != term) {
          peVar11 = std::
                    __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_1b8);
          peVar8 = std::
                   __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar11->rVal);
          if ((peVar8->super_AstExpr).type != unary) {
            peVar11 = std::
                      __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_1b8);
            peVar8 = std::
                     __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&peVar11->rVal);
            if ((peVar8->super_AstExpr).type != parenthesis) {
              peVar11 = std::
                        __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_1b8);
              peVar8 = std::
                       __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&peVar11->rVal);
              if ((peVar8->super_AstExpr).type != functionCall) {
                peVar11 = std::
                          __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)local_1b8);
                peVar8 = std::
                         __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&peVar11->rVal);
                if ((peVar8->super_AstExpr).type != refer) {
                  peVar11 = std::
                            __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)local_1b8);
                  peVar8 = std::
                           __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)&peVar11->rVal);
                  if ((peVar8->super_AstExpr).type != derefer) goto LAB_00238b86;
                }
              }
            }
          }
        }
        lOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = vt;
      }
    }
  }
  else {
    peVar11 = std::
              __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1b8);
    peVar8 = std::__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar11->lVal);
    if ((peVar8->super_AstExpr).type == literal) {
      peVar11 = std::
                __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_1b8);
      std::__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&peVar11->lVal);
      AstExpr::as<nigel::AstLiteral>((AstExpr *)local_2e0);
      IM_Constant::fromAstLiteral
                ((IM_Constant *)(local_2e0 + 0x10),(shared_ptr<nigel::AstLiteral> *)local_2e0);
      std::shared_ptr<nigel::IM_Operator>::operator=
                ((shared_ptr<nigel::IM_Operator> *)
                 &rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,(shared_ptr<nigel::IM_Constant> *)(local_2e0 + 0x10));
      std::shared_ptr<nigel::IM_Constant>::~shared_ptr
                ((shared_ptr<nigel::IM_Constant> *)(local_2e0 + 0x10));
      std::shared_ptr<nigel::AstLiteral>::~shared_ptr((shared_ptr<nigel::AstLiteral> *)local_2e0);
      peVar11 = std::
                __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_1b8);
      peVar8 = std::
               __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar11->rVal);
      if ((peVar8->super_AstExpr).type == variable) {
        lOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = cv;
      }
      else {
        peVar11 = std::
                  __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_1b8);
        peVar8 = std::
                 __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar11->rVal);
        if ((peVar8->super_AstExpr).type == literal) {
          lOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = cc;
        }
        else {
          peVar11 = std::
                    __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_1b8);
          peVar8 = std::
                   __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar11->rVal);
          if ((peVar8->super_AstExpr).type != term) {
            peVar11 = std::
                      __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_1b8);
            peVar8 = std::
                     __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&peVar11->rVal);
            if ((peVar8->super_AstExpr).type != unary) {
              peVar11 = std::
                        __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_1b8);
              peVar8 = std::
                       __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&peVar11->rVal);
              if ((peVar8->super_AstExpr).type != parenthesis) {
                peVar11 = std::
                          __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)local_1b8);
                peVar8 = std::
                         __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&peVar11->rVal);
                if ((peVar8->super_AstExpr).type != functionCall) {
                  peVar11 = std::
                            __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)local_1b8);
                  peVar8 = std::
                           __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)&peVar11->rVal);
                  if ((peVar8->super_AstExpr).type != refer) {
                    peVar11 = std::
                              __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)local_1b8);
                    peVar8 = std::
                             __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)&peVar11->rVal);
                    if ((peVar8->super_AstExpr).type != derefer) goto LAB_00238b86;
                  }
                }
              }
            }
          }
          lOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = ct;
        }
      }
    }
    else {
      peVar11 = std::
                __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_1b8);
      peVar8 = std::
               __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar11->lVal);
      if ((peVar8->super_AstExpr).type != term) {
        peVar11 = std::
                  __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_1b8);
        peVar8 = std::
                 __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar11->lVal);
        if ((peVar8->super_AstExpr).type != unary) {
          peVar11 = std::
                    __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_1b8);
          peVar8 = std::
                   __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar11->lVal);
          if ((peVar8->super_AstExpr).type != parenthesis) {
            peVar11 = std::
                      __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_1b8);
            peVar8 = std::
                     __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&peVar11->lVal);
            if ((peVar8->super_AstExpr).type != functionCall) {
              peVar11 = std::
                        __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_1b8);
              peVar8 = std::
                       __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&peVar11->lVal);
              if ((peVar8->super_AstExpr).type != refer) {
                peVar11 = std::
                          __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)local_1b8);
                peVar8 = std::
                         __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&peVar11->lVal);
                if ((peVar8->super_AstExpr).type != derefer) goto LAB_00238b86;
              }
            }
          }
        }
      }
      peVar11 = std::
                __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_1b8);
      std::shared_ptr<nigel::AstExpr>::shared_ptr<nigel::AstReturning,void>
                (&local_2f0,&peVar11->lVal);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::map(&local_320,varList);
      parseAst(this,&local_2f0,&local_320);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::IM_Variable>_>_>_>
      ::~map(&local_320);
      std::shared_ptr<nigel::AstExpr>::~shared_ptr(&local_2f0);
      peVar11 = std::
                __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_1b8);
      peVar8 = std::
               __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar11->rVal);
      if ((peVar8->super_AstExpr).type == variable) {
        lOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = tv;
      }
      else {
        peVar11 = std::
                  __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_1b8);
        peVar8 = std::
                 __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar11->rVal);
        if ((peVar8->super_AstExpr).type == literal) {
          lOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = tc;
        }
        else {
          peVar11 = std::
                    __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_1b8);
          peVar8 = std::
                   __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar11->rVal);
          if ((peVar8->super_AstExpr).type != term) {
            peVar11 = std::
                      __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_1b8);
            peVar8 = std::
                     __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&peVar11->rVal);
            if ((peVar8->super_AstExpr).type != unary) {
              peVar11 = std::
                        __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_1b8);
              peVar8 = std::
                       __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&peVar11->rVal);
              if ((peVar8->super_AstExpr).type != parenthesis) {
                peVar11 = std::
                          __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)local_1b8);
                peVar8 = std::
                         __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&peVar11->rVal);
                if ((peVar8->super_AstExpr).type != functionCall) {
                  peVar11 = std::
                            __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)local_1b8);
                  peVar8 = std::
                           __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)&peVar11->rVal);
                  if ((peVar8->super_AstExpr).type != refer) {
                    peVar11 = std::
                              __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)local_1b8);
                    peVar8 = std::
                             __shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)&peVar11->rVal);
                    if ((peVar8->super_AstExpr).type != derefer) goto LAB_00238b86;
                  }
                }
              }
            }
          }
          lOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = tt;
          IM_SFR::getSFR((SFR)&local_340);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_330,&local_340)
          ;
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_350,(nullptr_t)0x0);
          addCmd(this,pop_adr,&local_330,&local_350);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_350);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_330);
          std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_340);
        }
      }
    }
  }
LAB_00238b86:
  peVar11 = std::
            __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_1b8);
  if (peVar11->op == op_eql) {
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_360,(nullptr_t)0x0);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_370,(nullptr_t)0x0);
    addCmd(this,clr_c,&local_360,&local_370);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_370);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_360);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr
              (&local_380,
               (shared_ptr<nigel::IM_Operator> *)
               &rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr
              (&local_390,(shared_ptr<nigel::IM_Operator> *)(local_1f0 + 0x10));
    peVar11 = std::
              __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1b8);
    std::shared_ptr<nigel::Token>::shared_ptr
              (&local_3a0,&(peVar11->super_AstCondition).super_AstExpr.token);
    generateOperation(this,lOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi._4_4_,sub_a_adr,sub_a_const,sub_a_atr0,&local_380,
                      &local_390,&local_3a0);
    std::shared_ptr<nigel::Token>::~shared_ptr(&local_3a0);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_390);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_380);
    IM_Constant::fromConstant((u8)&local_3c0);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_Constant,void>(&local_3b0,&local_3c0);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_3d0,(nullptr_t)0x0);
    addCmd(this,jmp_nz_rel,&local_3b0,&local_3d0);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_3d0);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_3b0);
    std::shared_ptr<nigel::IM_Constant>::~shared_ptr(&local_3c0);
  }
  else {
    peVar11 = std::
              __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1b8);
    if (peVar11->op == op_not_eql) {
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_3e0,(nullptr_t)0x0);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_3f0,(nullptr_t)0x0);
      addCmd(this,clr_c,&local_3e0,&local_3f0);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_3f0);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_3e0);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr
                (&local_400,
                 (shared_ptr<nigel::IM_Operator> *)
                 &rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::shared_ptr<nigel::IM_Operator>::shared_ptr
                (&local_410,(shared_ptr<nigel::IM_Operator> *)(local_1f0 + 0x10));
      peVar11 = std::
                __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_1b8);
      std::shared_ptr<nigel::Token>::shared_ptr
                (&local_420,&(peVar11->super_AstCondition).super_AstExpr.token);
      generateOperation(this,lOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._4_4_,sub_a_adr,sub_a_const,sub_a_atr0,&local_400,
                        &local_410,&local_420);
      std::shared_ptr<nigel::Token>::~shared_ptr(&local_420);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_410);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_400);
      IM_Constant::fromConstant((u8)&local_440);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_Constant,void>
                (&local_430,&local_440);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_450,(nullptr_t)0x0);
      addCmd(this,jmp_z_rel,&local_430,&local_450);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_450);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_430);
      std::shared_ptr<nigel::IM_Constant>::~shared_ptr(&local_440);
    }
    else {
      peVar11 = std::
                __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_1b8);
      if (peVar11->op == op_less) {
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_460,(nullptr_t)0x0);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_470,(nullptr_t)0x0);
        addCmd(this,clr_c,&local_460,&local_470);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_470);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_460);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr
                  (&local_480,
                   (shared_ptr<nigel::IM_Operator> *)
                   &rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr
                  (&local_490,(shared_ptr<nigel::IM_Operator> *)(local_1f0 + 0x10));
        peVar11 = std::
                  __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_1b8);
        std::shared_ptr<nigel::Token>::shared_ptr
                  (&local_4a0,&(peVar11->super_AstCondition).super_AstExpr.token);
        generateOperation(this,lOp.
                               super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._4_4_,sub_a_adr,sub_a_const,sub_a_atr0,&local_480,
                          &local_490,&local_4a0);
        std::shared_ptr<nigel::Token>::~shared_ptr(&local_4a0);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_490);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_480);
        IM_Constant::fromConstant((u8)&local_4c0);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_Constant,void>
                  (&local_4b0,&local_4c0);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_4d0,(nullptr_t)0x0);
        addCmd(this,jmp_nc_rel,&local_4b0,&local_4d0);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_4d0);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_4b0);
        std::shared_ptr<nigel::IM_Constant>::~shared_ptr(&local_4c0);
      }
      else {
        peVar11 = std::
                  __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_1b8);
        if (peVar11->op == op_more) {
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_4e0,(nullptr_t)0x0);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_4f0,(nullptr_t)0x0);
          addCmd(this,clr_c,&local_4e0,&local_4f0);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_4f0);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_4e0);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr
                    (&local_500,
                     (shared_ptr<nigel::IM_Operator> *)
                     &rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr
                    (&local_510,(shared_ptr<nigel::IM_Operator> *)(local_1f0 + 0x10));
          peVar11 = std::
                    __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_1b8);
          std::shared_ptr<nigel::Token>::shared_ptr
                    (&local_520,&(peVar11->super_AstCondition).super_AstExpr.token);
          generateOperation(this,lOp.
                                 super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi._4_4_,sub_a_adr,sub_a_const,sub_a_atr0,&local_500
                            ,&local_510,&local_520);
          std::shared_ptr<nigel::Token>::~shared_ptr(&local_520);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_510);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_500);
          IM_Constant::fromConstant((u8)&local_540);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_Constant,void>
                    (&local_530,&local_540);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_550,(nullptr_t)0x0);
          addCmd(this,jmp_c_rel,&local_530,&local_550);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_550);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_530);
          std::shared_ptr<nigel::IM_Constant>::~shared_ptr(&local_540);
          IM_Constant::fromConstant((u8)&local_570);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_Constant,void>
                    (&local_560,&local_570);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_580,(nullptr_t)0x0);
          addCmd(this,jmp_z_rel,&local_560,&local_580);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_580);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_560);
          std::shared_ptr<nigel::IM_Constant>::~shared_ptr(&local_570);
        }
        else {
          peVar11 = std::
                    __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_1b8);
          if (peVar11->op == op_less_eql) {
            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_590,(nullptr_t)0x0);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_5a0,(nullptr_t)0x0);
            addCmd(this,clr_c,&local_590,&local_5a0);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_5a0);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_590);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr
                      (&local_5b0,
                       (shared_ptr<nigel::IM_Operator> *)
                       &rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr
                      (&local_5c0,(shared_ptr<nigel::IM_Operator> *)(local_1f0 + 0x10));
            peVar11 = std::
                      __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_1b8);
            std::shared_ptr<nigel::Token>::shared_ptr
                      (&local_5d0,&(peVar11->super_AstCondition).super_AstExpr.token);
            generateOperation(this,lOp.
                                   super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi._4_4_,sub_a_adr,sub_a_const,sub_a_atr0,
                              &local_5b0,&local_5c0,&local_5d0);
            std::shared_ptr<nigel::Token>::~shared_ptr(&local_5d0);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_5c0);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_5b0);
            IM_Constant::fromConstant((u8)&local_5f0);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_Constant,void>
                      (&local_5e0,&local_5f0);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_600,(nullptr_t)0x0);
            addCmd(this,jmp_c_rel,&local_5e0,&local_600);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_600);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_5e0);
            std::shared_ptr<nigel::IM_Constant>::~shared_ptr(&local_5f0);
            IM_Constant::fromConstant((u8)&local_620);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_Constant,void>
                      (&local_610,&local_620);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_630,(nullptr_t)0x0);
            addCmd(this,jmp_nz_rel,&local_610,&local_630);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_630);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_610);
            std::shared_ptr<nigel::IM_Constant>::~shared_ptr(&local_620);
          }
          else {
            peVar11 = std::
                      __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_1b8);
            if (peVar11->op == op_more_eql) {
              std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_640,(nullptr_t)0x0);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_650,(nullptr_t)0x0);
              addCmd(this,clr_c,&local_640,&local_650);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_650);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_640);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr
                        (&local_660,
                         (shared_ptr<nigel::IM_Operator> *)
                         &rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr
                        (&local_670,(shared_ptr<nigel::IM_Operator> *)(local_1f0 + 0x10));
              peVar11 = std::
                        __shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_1b8);
              std::shared_ptr<nigel::Token>::shared_ptr
                        (&local_680,&(peVar11->super_AstCondition).super_AstExpr.token);
              generateOperation(this,lOp.
                                     super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi._4_4_,sub_a_adr,sub_a_const,sub_a_atr0,
                                &local_660,&local_670,&local_680);
              std::shared_ptr<nigel::Token>::~shared_ptr(&local_680);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_670);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_660);
              IM_Constant::fromConstant((u8)&local_6a0);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_Constant,void>
                        (&local_690,&local_6a0);
              p_Var1 = &a_1.
                        super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount;
              std::shared_ptr<nigel::IM_Operator>::shared_ptr
                        ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
              addCmd(this,jmp_c_rel,&local_690,(shared_ptr<nigel::IM_Operator> *)p_Var1);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                        ((shared_ptr<nigel::IM_Operator> *)
                         &a_1.
                          super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_690);
              std::shared_ptr<nigel::IM_Constant>::~shared_ptr(&local_6a0);
            }
          }
        }
      }
    }
  }
  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
            ((shared_ptr<nigel::IM_Operator> *)(local_1f0 + 0x10));
  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
            ((shared_ptr<nigel::IM_Operator> *)
             &rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<nigel::AstComparisonCondition>::~shared_ptr
            ((shared_ptr<nigel::AstComparisonCondition> *)local_1b8);
  return;
}

Assistant:

void IMC_Generator::parseCondition( std::shared_ptr<AstExpr> ast, std::map<String, std::shared_ptr<IM_Variable>> varList )
	{
		if( ast->type == AstExpr::Type::booleanParenthesis )
		{//Parenthesis block
			parseCondition( ast->as<AstBooleanParenthesis>()->content, varList );
		}
		else if( ast->type == AstExpr::Type::keywordCondition )
		{//Keyword (true/false)
			if( !ast->as<AstKeywordCondition>()->val )
			{//Is false
				addCmd( HexOp::jmp_rel, IM_Constant::fromConstant( 2 ) );
			}
		}
		else if( ast->type == AstExpr::Type::arithmenticCondition )
		{//Arithmetic expression will be converted into boolean expression (0=false)
			auto ret = ast->as<AstArithmeticCondition>()->ret;
			OperationType ot;//Operator type combination
			std::shared_ptr<IM_Operator> op;

			//Memorize val
			if( ret->type == AstExpr::Type::variable )
			{
				ot = OT::v;
				op = varList[ret->as<AstVariable>()->name];
			}
			else if( ret->type == AstExpr::Type::literal )
			{
				ot = OT::c;
				op = IM_Constant::fromAstLiteral( ret->as<AstLiteral>() );
			}
			else if( ret->type == AstExpr::Type::term ||
					 ret->type == AstExpr::Type::unary ||
					 ret->type == AstExpr::Type::parenthesis ||
					 ret->type == AstExpr::Type::functionCall ||
					 ret->type == AstExpr::Type::refer ||
					 ret->type == AstExpr::Type::derefer )
			{
				ot = OT::t;
				parseAst( ret, varList );
			}

			generateMoveA( ot, op );
			addCmd( HexOp::jmp_z_rel, IM_Constant::fromConstant( 2 ) );
		}
		else if( ast->type == AstExpr::Type::comparisonCondition )
		{//Comparison of two returnables
			auto a = ast->as<AstComparisonCondition>();
			OC comb;//Operator type combination
			std::shared_ptr<IM_Operator> lOp;
			std::shared_ptr<IM_Operator> rOp;

			//Memorize rVal
			if( a->rVal->type == AstExpr::Type::variable ) rOp = varList[a->rVal->as<AstVariable>()->name];
			else if( a->rVal->type == AstExpr::Type::literal ) rOp = IM_Constant::fromAstLiteral( a->rVal->as<AstLiteral>() );
			else if( a->rVal->type == AstExpr::Type::term ||
					 a->rVal->type == AstExpr::Type::unary ||
					 a->rVal->type == AstExpr::Type::parenthesis ||
					 a->rVal->type == AstExpr::Type::functionCall ||
					 a->rVal->type == AstExpr::Type::refer ||
					 a->rVal->type == AstExpr::Type::derefer )
			{
				parseAst( a->rVal, varList );
				if( a->lVal->type == AstExpr::Type::term ||
					a->lVal->type == AstExpr::Type::unary ||
					a->lVal->type == AstExpr::Type::parenthesis ||
					a->lVal->type == AstExpr::Type::functionCall ||
					a->lVal->type == AstExpr::Type::refer ||
					a->lVal->type == AstExpr::Type::derefer )//push to stack if OC::tt
					addCmd( HexOp::push_adr, IM_SFR::getSFR( IM_SFR::SFR::A ) );
				else addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			//Check lValue and combination
			if( a->lVal->type == AstExpr::Type::variable )
			{//lValue is a variable
				lOp = varList[a->lVal->as<AstVariable>()->name];
				if( a->rVal->type == AstExpr::Type::variable ) comb = OC::vv;
				else if( a->rVal->type == AstExpr::Type::literal ) comb = OC::vc;
				else if( a->rVal->type == AstExpr::Type::term ||
						 a->rVal->type == AstExpr::Type::unary ||
						 a->rVal->type == AstExpr::Type::parenthesis ||
						 a->rVal->type == AstExpr::Type::functionCall ||
						 a->rVal->type == AstExpr::Type::refer ||
						 a->rVal->type == AstExpr::Type::derefer ) comb = OC::vt;
			}
			else if( a->lVal->type == AstExpr::Type::literal )
			{//lValue is a constant
				lOp = IM_Constant::fromAstLiteral( a->lVal->as<AstLiteral>() );
				if( a->rVal->type == AstExpr::Type::variable ) comb = OC::cv;
				else if( a->rVal->type == AstExpr::Type::literal ) comb = OC::cc;
				else if( a->rVal->type == AstExpr::Type::term ||
						 a->rVal->type == AstExpr::Type::unary ||
						 a->rVal->type == AstExpr::Type::parenthesis ||
						 a->rVal->type == AstExpr::Type::functionCall ||
						 a->rVal->type == AstExpr::Type::refer ||
						 a->rVal->type == AstExpr::Type::derefer ) comb = OC::ct;
			}
			else if( a->lVal->type == AstExpr::Type::term ||
					 a->lVal->type == AstExpr::Type::unary ||
					 a->lVal->type == AstExpr::Type::parenthesis ||
					 a->lVal->type == AstExpr::Type::functionCall ||
					 a->lVal->type == AstExpr::Type::refer ||
					 a->lVal->type == AstExpr::Type::derefer )
			{//lValue is a term
				parseAst( a->lVal, varList );
				if( a->rVal->type == AstExpr::Type::variable ) comb = OC::tv;
				else if( a->rVal->type == AstExpr::Type::literal ) comb = OC::tc;
				else if( a->rVal->type == AstExpr::Type::term ||
						 a->rVal->type == AstExpr::Type::unary ||
						 a->rVal->type == AstExpr::Type::parenthesis ||
						 a->rVal->type == AstExpr::Type::functionCall ||
						 a->rVal->type == AstExpr::Type::refer ||
						 a->rVal->type == AstExpr::Type::derefer )
				{//pop from stack to B
					comb = OC::tt;
					addCmd( HexOp::pop_adr, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				}
			}

			//Handle operation
			if( a->op == Token::Type::op_eql )
			{// ==
				addCmd( HexOp::clr_c );
				generateOperation( comb, HexOp::sub_a_adr, HexOp::sub_a_const, HexOp::sub_a_atr0, lOp, rOp, a->token );
				addCmd( HexOp::jmp_nz_rel, IM_Constant::fromConstant( 2 ) );
			}
			else if( a->op == Token::Type::op_not_eql )
			{// !=
				addCmd( HexOp::clr_c );
				generateOperation( comb, HexOp::sub_a_adr, HexOp::sub_a_const, HexOp::sub_a_atr0, lOp, rOp, a->token );
				addCmd( HexOp::jmp_z_rel, IM_Constant::fromConstant( 2 ) );
			}
			else if( a->op == Token::Type::op_less )
			{// <
				addCmd( HexOp::clr_c );
				generateOperation( comb, HexOp::sub_a_adr, HexOp::sub_a_const, HexOp::sub_a_atr0, lOp, rOp, a->token );
				addCmd( HexOp::jmp_nc_rel, IM_Constant::fromConstant( 2 ) );
			}
			else if( a->op == Token::Type::op_more )
			{// >
				addCmd( HexOp::clr_c );
				generateOperation( comb, HexOp::sub_a_adr, HexOp::sub_a_const, HexOp::sub_a_atr0, lOp, rOp, a->token );
				addCmd( HexOp::jmp_c_rel, IM_Constant::fromConstant( 4 ) );
				addCmd( HexOp::jmp_z_rel, IM_Constant::fromConstant( 2 ) );
			}
			else if( a->op == Token::Type::op_less_eql )
			{// <=
				addCmd( HexOp::clr_c );
				generateOperation( comb, HexOp::sub_a_adr, HexOp::sub_a_const, HexOp::sub_a_atr0, lOp, rOp, a->token );
				addCmd( HexOp::jmp_c_rel, IM_Constant::fromConstant( 2 ) );//Is true -> ignore next
				addCmd( HexOp::jmp_nz_rel, IM_Constant::fromConstant( 2 ) );
			}
			else if( a->op == Token::Type::op_more_eql )
			{// >=
				addCmd( HexOp::clr_c );
				generateOperation( comb, HexOp::sub_a_adr, HexOp::sub_a_const, HexOp::sub_a_atr0, lOp, rOp, a->token );
				addCmd( HexOp::jmp_c_rel, IM_Constant::fromConstant( 2 ) );
			}

		}
		else if( ast->type == AstExpr::Type::combinationCondition )
		{//Combination of two conditionals
			auto a = ast->as<AstComparisonCondition>();

			if( a->op == Token::Type::op_and_log )
			{// &&
				u32 id = IM_Condition::getNextConditionPos();

				parseCondition( a->lVal, varList );
				addCmd( HexOp::jmp_rel, IM_Constant::fromConstant( 3 ) );//true
				addCmd( HexOp::jmp_abs, IM_Condition::getNew( id, false ) );//false
				parseCondition( a->rVal, varList );

				auto conditionPos = std::make_shared<IM_Command>();
				conditionPos->type = IM_Command::Type::conditionEnd;
				conditionPos->id = id;
				base->imCommands.push_back( conditionPos );
			}
			else if( a->op == Token::Type::op_or_log )
			{// ||
				u32 id = IM_Condition::getNextConditionPos();

				parseCondition( a->lVal, varList );
				addCmd( HexOp::jmp_rel, IM_Constant::fromConstant( 2 ) );//true. Has to be a rel jmp because next command (2byte) will be false-jmp-destination.
				addCmd( HexOp::jmp_rel, IM_Constant::fromConstant( 3 ) );
				addCmd( HexOp::jmp_abs, IM_Condition::getNew( id, true ) );//true
				parseCondition( a->rVal, varList );

				auto conditionPos = std::make_shared<IM_Command>();
				conditionPos->type = IM_Command::Type::conditionEnd;
				conditionPos->id = id;
				base->imCommands.push_back( conditionPos );
			}
			else if( a->op == Token::Type::op_not )
			{// !
				parseCondition( a->rVal, varList );
				addCmd( HexOp::jmp_rel, IM_Constant::fromConstant( 2 ) );
			}
		}
		else
		{//Unknown condition ast
			generateNotification( NT::err_expectConditionInParanthesis, ast->token );
		}
	}